

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<float> fmt::v8::detail::dragonbox::to_decimal<float>(float x)

{
  decimal_fp<float> dVar1;
  bool bVar2;
  uint uVar3;
  carrier_uint cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  decimal_fp<float> dVar9;
  bool approx_y_parity;
  uint32_t dist;
  uint32_t mask;
  carrier_uint two_fl;
  uint32_t r;
  carrier_uint zi;
  carrier_uint two_fr;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta_minus_1;
  cache_entry_type cache;
  int minus_k;
  bool include_right_endpoint;
  bool include_left_endpoint;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  uint br;
  decimal_fp<float> ret_value;
  carrier_uint zi_1;
  carrier_uint xi;
  cache_entry_type cache_1;
  int beta_minus_1_1;
  int minus_k_1;
  decimal_fp<float> ret_value_1;
  int s;
  uint32_t max_quotient2;
  uint32_t mod_inv2;
  uint32_t max_quotient1;
  uint32_t mod_inv1;
  int t;
  int s_1;
  uint32_t max_quotient2_1;
  uint32_t mod_inv2_1;
  uint32_t max_quotient1_1;
  uint32_t mod_inv1_1;
  int t_1;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  carrier_uint in_stack_ffffffffffffff20;
  carrier_uint in_stack_ffffffffffffff24;
  significand_type sVar10;
  uint local_d4;
  uint local_bc [3];
  uint local_b0;
  carrier_uint local_ac;
  uint local_a8;
  uint local_a4;
  uint32_t local_a0;
  int local_9c;
  uint64_t local_98;
  int local_8c;
  byte local_86;
  byte local_85;
  int local_84;
  uint local_80;
  undefined4 local_7c;
  uint local_78;
  float local_74;
  decimal_fp<float> local_70;
  uint local_68;
  carrier_uint local_64;
  uint64_t local_60;
  int local_54;
  int local_50;
  int local_4c;
  uint local_48;
  int iStack_44;
  int local_40;
  int local_2c;
  uint *local_28;
  int local_20;
  int local_c;
  decimal_fp<float> *local_8;
  
  uVar3 = bit_cast<unsigned_int,float>(&local_74);
  local_7c = 0x7fffff;
  local_80 = uVar3 & 0x7fffff;
  local_78 = uVar3;
  cVar4 = exponent_mask<float>();
  uVar5 = (uVar3 & cVar4) >> 0x17;
  if (uVar5 == 0) {
    if (local_80 == 0) {
      dVar9.significand = 0;
      dVar9.exponent = 0;
      return dVar9;
    }
    local_84 = -0x95;
  }
  else {
    local_84 = uVar5 - 0x96;
    if (local_80 == 0) {
      local_4c = local_84;
      local_50 = floor_log10_pow2_minus_log10_4_over_3(in_stack_ffffffffffffff24);
      iVar6 = local_4c;
      local_54 = floor_log2_pow10(uVar3);
      local_54 = iVar6 + local_54;
      local_60 = cache_accessor<float>::get_cached_power(0);
      local_64 = cache_accessor<float>::compute_left_endpoint_for_shorter_interval_case
                           (&local_60,local_54);
      local_68 = cache_accessor<float>::compute_right_endpoint_for_shorter_interval_case
                           (&local_60,local_54);
      bVar2 = is_left_endpoint_integer_shorter_interval<float>(local_4c);
      if (!bVar2) {
        local_64 = local_64 + 1;
      }
      local_48 = local_68 / 10;
      if (local_48 * 10 < local_64) {
        local_d4 = cache_accessor<float>::compute_round_up_for_shorter_interval_case
                             (&local_60,local_54);
        iStack_44 = local_50;
        if ((local_4c < -0x23) || (-0x23 < local_4c)) {
          local_48 = local_d4;
          if (local_d4 < local_64) {
            local_48 = local_d4 + 1;
          }
        }
        else {
          if ((local_d4 & 1) != 0) {
            local_d4 = local_d4 - 1;
          }
          local_48 = local_d4;
        }
      }
      else {
        iStack_44 = local_50 + 1;
        local_28 = &local_48;
        local_2c = 0;
        for (uVar3 = local_48; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
          local_2c = local_2c + 1;
        }
        if (7 < local_2c) {
          local_2c = 7;
        }
        local_40 = 0;
        while ((local_40 < local_2c + -1 && (*local_28 * -0x3d70a3d7 < 0xa3d70a4))) {
          *local_28 = *local_28 * -0x3d70a3d7;
          local_40 = local_40 + 2;
        }
        if ((local_40 < local_2c) && (*local_28 * -0x33333333 < 0x33333334)) {
          *local_28 = *local_28 * -0x33333333;
          local_40 = local_40 + 1;
        }
        *local_28 = *local_28 >> ((byte)local_40 & 0x1f);
        iStack_44 = local_40 + iStack_44;
      }
      dVar1.exponent = iStack_44;
      dVar1.significand = local_48;
      return dVar1;
    }
    local_80 = local_80 | 0x800000;
  }
  local_86 = (local_80 & 1) == 0;
  local_85 = local_86;
  local_8c = floor_log10_pow2(in_stack_ffffffffffffff24);
  local_8c = local_8c + -1;
  local_98 = cache_accessor<float>::get_cached_power(0);
  iVar6 = local_84;
  local_9c = floor_log2_pow10(uVar3);
  local_9c = iVar6 + local_9c;
  local_a0 = cache_accessor<float>::compute_delta(&local_98,local_9c);
  local_a4 = local_80 << 1;
  local_a8 = local_a4 | 1;
  local_ac = cache_accessor<float>::compute_mul
                       (in_stack_ffffffffffffff24,
                        (cache_entry_type *)
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  uVar3 = divide_by_10_to_kappa_plus_1(local_ac);
  local_b0 = local_ac + uVar3 * -100;
  if (local_b0 <= local_a0) {
    if (local_b0 < local_a0) {
      if (((local_b0 != 0) || ((local_86 & 1) != 0)) ||
         (bVar2 = is_endpoint_integer<float>
                            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                             in_stack_ffffffffffffff18), !bVar2)) {
LAB_001914c9:
        local_70.exponent = local_8c + 2;
        local_70.significand = uVar3;
        local_8 = &local_70;
        local_c = 0;
        for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
          local_c = local_c + 1;
        }
        if (7 < local_c) {
          local_c = 7;
        }
        local_20 = 0;
        while ((local_20 < local_c + -1 && (local_8->significand * -0x3d70a3d7 < 0xa3d70a4))) {
          local_8->significand = local_8->significand * -0x3d70a3d7;
          local_20 = local_20 + 2;
        }
        if ((local_20 < local_c) && (local_8->significand * -0x33333333 < 0x33333334)) {
          local_8->significand = local_8->significand * -0x33333333;
          local_20 = local_20 + 1;
        }
        local_8->significand = local_8->significand >> ((byte)local_20 & 0x1f);
        local_70.exponent = local_20 + local_70.exponent;
        return local_70;
      }
      uVar3 = uVar3 - 1;
      local_b0 = 100;
    }
    else {
      local_bc[2] = local_a4 - 1;
      if ((((local_85 & 1) != 0) &&
          (bVar2 = is_endpoint_integer<float>
                             (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                              in_stack_ffffffffffffff18), bVar2)) ||
         (bVar2 = cache_accessor<float>::compute_mul_parity
                            (in_stack_ffffffffffffff24,
                             (cache_entry_type *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0), bVar2
         )) goto LAB_001914c9;
    }
  }
  iVar6 = uVar3 * 10;
  iVar7 = local_8c + 1;
  local_bc[1] = 1;
  local_bc[0] = (local_b0 - (local_a0 >> 1)) + 5;
  if ((local_bc[0] & 1) == 0) {
    uVar3 = local_bc[0] ^ 5;
    local_bc[0] = local_bc[0] >> 1;
    bVar2 = check_divisibility_and_divide_by_pow5<1>(local_bc);
    if (bVar2) {
      local_70.exponent = iVar7;
      local_70.significand = local_bc[0] + iVar6;
      bVar2 = cache_accessor<float>::compute_mul_parity
                        (in_stack_ffffffffffffff24,
                         (cache_entry_type *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
      if (bVar2 == ((uVar3 & 1) != 0)) {
        bVar2 = is_center_integer<float>
                          (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                           in_stack_ffffffffffffff18);
        if (bVar2) {
          sVar10 = local_70.significand;
          if (((ulong)local_70 & 1) != 0) {
            sVar10 = local_70.significand - 1;
          }
          local_70.significand = sVar10;
        }
      }
      else {
        local_70.significand = local_70.significand - 1;
      }
    }
    else {
      local_70.exponent = iVar7;
      local_70.significand = local_bc[0] + iVar6;
    }
  }
  else {
    uVar8 = small_division_by_pow10<1>(in_stack_ffffffffffffff24);
    local_70.exponent = iVar7;
    local_70.significand = uVar8 + iVar6;
  }
  return local_70;
}

Assistant:

decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}